

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

void __thiscall OpenMD::MoleculeStamp::checkBonds(MoleculeStamp *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pointer piVar4;
  pointer pcVar5;
  int __tmp;
  pointer ppBVar6;
  iterator iVar7;
  ostream *poVar8;
  OpenMDException *pOVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  pair<int,_int> bondPair;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  allBonds;
  ostringstream oss;
  string local_200;
  key_type local_1e0;
  undefined1 local_1d8 [32];
  _Base_ptr local_1b8;
  size_t local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppBVar6 = (this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar10 = (long)(this->bondStamps_).
                 super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar6;
  if (lVar10 != 0) {
    lVar10 = lVar10 >> 3;
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    lVar14 = 0;
    do {
      lVar3 = *(long *)((long)ppBVar6 + (lVar14 >> 0x1d));
      iVar1 = *(int *)(lVar3 + 0xa0);
      iVar12 = (int)((ulong)((long)(this->atomStamps_).
                                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->atomStamps_).
                                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((((iVar12 <= iVar1) || (iVar1 < 0)) || (iVar2 = *(int *)(lVar3 + 0xa4), iVar1 == iVar2))
         || ((iVar12 <= iVar2 || (iVar2 < 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar5 = (this->Name).data_._M_dataplus._M_p;
        local_1d8._0_8_ = local_1d8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1d8._0_8_,
                            CONCAT44(local_1d8._12_4_,local_1d8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": bond(",7);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*(int *)(lVar3 + 0xa0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*(int *)(lVar3 + 0xa4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") is invalid\n",0xd);
        if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
        }
        pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar9,(string *)local_1d8);
        __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      lVar14 = lVar14 + 0x100000000;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  local_1d8._24_8_ = local_1d8 + 8;
  local_1d8._8_4_ = _S_red;
  local_1d8._16_8_ = (_Base_ptr)0x0;
  local_1b0 = 0;
  ppBVar6 = (this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1b8 = (_Base_ptr)local_1d8._24_8_;
  if ((this->bondStamps_).
      super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppBVar6) {
    uVar11 = 0;
  }
  else {
    lVar10 = 0;
    uVar13 = 0;
    do {
      lVar14 = *(long *)((long)ppBVar6 + (lVar10 >> 0x1d));
      iVar1 = *(int *)(lVar14 + 0xa0);
      local_1e0.second = *(int *)(lVar14 + 0xa4);
      local_1e0.first = iVar1;
      if (local_1e0.second < iVar1) {
        local_1e0.first = local_1e0.second;
        local_1e0.second = iVar1;
      }
      iVar7 = std::
              _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              ::find((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                      *)local_1d8,&local_1e0);
      if (iVar7._M_node != (_Base_ptr)(local_1d8 + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar5 = (this->Name).data_._M_dataplus._M_p;
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                            local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"bond(",5);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar7._M_node[1]._M_color);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar8,*(int *)&iVar7._M_node[1].field_0x4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") appears multiple times\n",0x19)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar9,&local_200);
        __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>const&>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)local_1d8,&local_1e0);
      uVar13 = uVar13 + 1;
      ppBVar6 = (this->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(this->bondStamps_).
                     super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar6 >> 3;
      lVar10 = lVar10 + 0x100000000;
    } while (uVar13 < uVar11);
  }
  if (uVar11 != 0) {
    piVar4 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      lVar14 = *(long *)((long)ppBVar6 + (lVar10 >> 0x1d));
      if (piVar4[*(int *)(lVar14 + 0xa0)] == piVar4[*(int *)(lVar14 + 0xa4)]) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar5 = (this->Name).data_._M_dataplus._M_p;
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                            local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"bond(",5);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*(int *)(lVar14 + 0xa0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*(int *)(lVar14 + 0xa4));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,") belong to same rigidbody ",0x1b);
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar8,
                            (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[*(int *)(lVar14 + 0xa0)]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        pOVar9 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar9,&local_200);
        __cxa_throw(pOVar9,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      lVar10 = lVar10 + 0x100000000;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *)local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MoleculeStamp::checkBonds() {
    std::ostringstream oss;
    // make sure index is not out of range
    int natoms = static_cast<int>(getNAtoms());
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      if (bondStamp->getA() > natoms - 1 || bondStamp->getA() < 0 ||
          bondStamp->getB() > natoms - 1 || bondStamp->getB() < 0 ||
          bondStamp->getA() == bondStamp->getB()) {
        oss << "Error in Molecule " << getName() << ": bond("
            << bondStamp->getA() << ", " << bondStamp->getB()
            << ") is invalid\n";
        throw OpenMDException(oss.str());
      }
    }

    // make sure bonds are unique
    std::set<std::pair<int, int>> allBonds;
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      std::pair<int, int> bondPair(bondStamp->getA(), bondStamp->getB());
      // make sure bondPair.first is always less than or equal to
      // bondPair.third
      if (bondPair.first > bondPair.second) {
        std::swap(bondPair.first, bondPair.second);
      }

      std::set<std::pair<int, int>>::iterator iter = allBonds.find(bondPair);
      if (iter != allBonds.end()) {
        oss << "Error in Molecule " << getName() << ": "
            << "bond(" << iter->first << ", " << iter->second
            << ") appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBonds.insert(bondPair);
      }
    }

    // make sure atoms belong to same rigidbody do not bond to each other
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      if (atom2Rigidbody[bondStamp->getA()] ==
          atom2Rigidbody[bondStamp->getB()]) {
        oss << "Error in Molecule " << getName() << ": "
            << "bond(" << bondStamp->getA() << ", " << bondStamp->getB()
            << ") belong to same rigidbody "
            << atom2Rigidbody[bondStamp->getA()] << "\n";
        throw OpenMDException(oss.str());
      }
    }
  }